

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O0

bool __thiscall
JsUtil::ReadOnlyList<Js::DebuggerPropertyDisplayInfo*,Memory::ArenaAllocator,DefaultComparer>::
Any<Js::RecyclableObjectWalker::GetChildrenCount()::__0>
          (ReadOnlyList<Js::DebuggerPropertyDisplayInfo*,Memory::ArenaAllocator,DefaultComparer>
           *this,anon_class_8_1_66460f8e function)

{
  bool bVar1;
  int local_24;
  int i;
  ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
  *this_local;
  anon_class_8_1_66460f8e function_local;
  
  local_24 = 0;
  this_local = (ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
                *)function.propertyId;
  while( true ) {
    if (*(int *)(this + 0x10) <= local_24) {
      return false;
    }
    bVar1 = Js::RecyclableObjectWalker::GetChildrenCount::anon_class_8_1_66460f8e::operator()
                      ((anon_class_8_1_66460f8e *)&this_local,
                       *(DebuggerPropertyDisplayInfo **)(*(long *)(this + 8) + (long)local_24 * 8));
    if (bVar1) break;
    local_24 = local_24 + 1;
  }
  return true;
}

Assistant:

bool Any(TConditionalFunction function)
        {
            for (int i = 0; i < count; ++i)
            {
                if (function(this->buffer[i]))
                {
                    return true;
                }
            }

            return false;
        }